

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void Json::CharReaderBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  ValueHolder local_1a0;
  undefined2 local_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  ValueHolder local_178;
  undefined2 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  ValueHolder local_150;
  undefined2 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  ValueHolder local_128;
  undefined2 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ValueHolder local_100;
  undefined2 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  ValueHolder local_d8;
  undefined2 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ValueHolder local_b0;
  undefined2 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  ValueHolder local_88;
  undefined2 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ValueHolder local_60;
  undefined2 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  ValueHolder local_38;
  undefined2 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_30 = 5;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_38.bool_ = true;
  pVVar1 = Value::operator[](settings,"collectComments");
  Value::swap(pVVar1,(Value *)&local_38);
  Value::~Value((Value *)&local_38);
  local_58 = 5;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  local_60.bool_ = true;
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::swap(pVVar1,(Value *)&local_60);
  Value::~Value((Value *)&local_60);
  local_80 = 5;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  local_88.bool_ = false;
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::swap(pVVar1,(Value *)&local_88);
  Value::~Value((Value *)&local_88);
  local_a8 = 5;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0;
  local_b0.bool_ = false;
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::swap(pVVar1,(Value *)&local_b0);
  Value::~Value((Value *)&local_b0);
  local_d0 = 5;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_d8.bool_ = false;
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::swap(pVVar1,(Value *)&local_d8);
  Value::~Value((Value *)&local_d8);
  local_f8 = 5;
  local_f0 = 0;
  uStack_e8 = 0;
  local_e0 = 0;
  local_100.bool_ = false;
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::swap(pVVar1,(Value *)&local_100);
  Value::~Value((Value *)&local_100);
  local_120 = 1;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = 0;
  local_128.int_ = 1000;
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::swap(pVVar1,(Value *)&local_128);
  Value::~Value((Value *)&local_128);
  local_148 = 5;
  local_140 = 0;
  uStack_138 = 0;
  local_130 = 0;
  local_150.bool_ = false;
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::swap(pVVar1,(Value *)&local_150);
  Value::~Value((Value *)&local_150);
  local_170 = 5;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  local_178.bool_ = false;
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::swap(pVVar1,(Value *)&local_178);
  Value::~Value((Value *)&local_178);
  local_198 = 5;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = 0;
  local_1a0.bool_ = false;
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::swap(pVVar1,(Value *)&local_1a0);
  Value::~Value((Value *)&local_1a0);
  return;
}

Assistant:

void CharReaderBuilder::setDefaults(Json::Value* settings)
{
//! [CharReaderBuilderDefaults]
  (*settings)["collectComments"] = true;
  (*settings)["allowComments"] = true;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = false;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
//! [CharReaderBuilderDefaults]
}